

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_in_struct
          (CompilerHLSL *this,SPIRVariable *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  ID *__k;
  uint uVar1;
  StorageClass SVar2;
  ExecutionModel EVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  SPIREntryPoint *pSVar7;
  SPIRType *pSVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  Bitset *pBVar11;
  CompilerError *pCVar12;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  bool bVar14;
  uint local_3ac;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_3a8;
  ID *local_3a0;
  SPIREntryPoint *local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string name;
  string semantic;
  string binding;
  SPIRType newtype;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  SPIRType type;
  
  local_3a8 = &active_locations->_M_h;
  pSVar7 = Compiler::get_entry_point((Compiler *)this);
  pSVar8 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  SPIRType::SPIRType(&type,pSVar8);
  binding._M_dataplus._M_p = (pointer)&binding.field_2;
  binding._M_string_length = 0;
  binding.field_2._M_local_buf[0] = '\0';
  bVar14 = var->storage == StorageClassOutput;
  bVar4 = pSVar7->model == ExecutionModelFragment;
  if (bVar14 && bVar4) {
    uVar1 = *(uint *)&(this->super_CompilerGLSL).field_0x241c;
    uVar5 = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationIndex);
    uVar6 = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    if (uVar6 != 0 && uVar5 != 0) {
      pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&newtype,"Dual-source blending is only supported on MRT #0 in HLSL.",
                 (allocator *)&name);
      CompilerError::CompilerError(pCVar12,(string *)&newtype);
      __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar13 = "SV_Target";
    if (uVar1 < 0x1f) {
      pcVar13 = "COLOR";
    }
    semantic._M_dataplus._M_p._0_4_ = uVar6 + uVar5;
    name._M_dataplus._M_p = pcVar13;
    join<char_const*,unsigned_int>
              ((string *)&newtype,(spirv_cross *)&name,(char **)&semantic,(uint *)"COLOR");
    ::std::__cxx11::string::operator=((string *)&binding,(string *)&newtype);
    ::std::__cxx11::string::~string((string *)&newtype);
    if (uVar1 < 0x1f) {
      type.vecsize = 4;
    }
  }
  SVar2 = var->storage;
  EVar3 = pSVar7->model;
  __k = &(var->super_IVariant).self;
  local_398 = pSVar7;
  pmVar9 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
  local_3a0 = __k;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&name,this,(ulong)__k->id,1);
  if (bVar14 && bVar4) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])(&newtype,this,&type,&name,0);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newtype,
               (char (*) [4])0x311100,&binding,(char (*) [2])0x304bae);
    pSVar8 = &newtype;
  }
  else {
    if (((pmVar9->decoration).decoration_flags.lower & 0x40000000) == 0) {
      newtype.super_IVariant._vptr_IVariant._0_4_ = 0;
      while( true ) {
        if (0x3f < (uint)newtype.super_IVariant._vptr_IVariant) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&newtype,"All locations from 0 to 63 are exhausted.",
                     (allocator *)&semantic);
          CompilerError::CompilerError(pCVar12,(string *)&newtype);
          __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        sVar10 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(local_3a8,(key_type *)&newtype);
        uVar5 = (uint)newtype.super_IVariant._vptr_IVariant;
        if (sVar10 == 0) break;
        newtype.super_IVariant._vptr_IVariant._0_4_ =
             (uint)newtype.super_IVariant._vptr_IVariant + 1;
      }
    }
    else {
      uVar5 = (pmVar9->decoration).location;
    }
    ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
    to_semantic_abi_cxx11_(&semantic,this,uVar5,local_398->model,var->storage);
    if ((SVar2 == StorageClassInput && EVar3 == ExecutionModelVertex) && 1 < type.columns) {
      if (type.array.super_VectorView<unsigned_int>.buffer_size != 0) {
        pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&newtype,
                   "Arrays of matrices used as input/output. This is not supported.",
                   (allocator *)&local_390);
        CompilerError::CompilerError(pCVar12,(string *)&newtype);
        __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      for (local_3ac = 0; local_3ac < type.columns; local_3ac = local_3ac + 1) {
        SPIRType::SPIRType(&newtype,&type);
        newtype.columns = 1;
        pBVar11 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_3a0->id);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])(&local_390,this,pBVar11);
        join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                  (&local_1c0,(spirv_cross *)&name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ed65,
                   (char (*) [2])&local_3ac,(uint *)ts_3);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                  (&local_1a0,this,&newtype,&local_1c0,0);
        ts_3 = &semantic;
        CompilerGLSL::
        statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&local_390,&local_1a0,(char (*) [4])0x311100,ts_3,
                   (char (*) [2])0x30ed65,&local_3ac,(char (*) [2])0x304bae);
        ::std::__cxx11::string::~string((string *)&local_1a0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_390);
        local_390._M_dataplus._M_p._0_4_ = uVar5;
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)local_3a8,(value_type *)&local_390);
        uVar5 = uVar5 + 1;
        SPIRType::~SPIRType(&newtype);
      }
    }
    else {
      pBVar11 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_3a0->id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])(&newtype,this,pBVar11);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                (&local_390,this,&type,&name,0);
      CompilerGLSL::
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newtype,
                 &local_390,(char (*) [4])0x311100,&semantic,(char (*) [2])0x304bae);
      ::std::__cxx11::string::~string((string *)&local_390);
      ::std::__cxx11::string::~string((string *)&newtype);
      uVar6 = type_to_consumed_locations(this,&type);
      while (bVar14 = uVar6 != 0, uVar6 = uVar6 - 1, bVar14) {
        newtype.super_IVariant._vptr_IVariant._0_4_ = uVar5;
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)local_3a8,(value_type *)&newtype);
        uVar5 = uVar5 + 1;
      }
    }
    pSVar8 = (SPIRType *)&semantic;
  }
  ::std::__cxx11::string::~string((string *)pSVar8);
  ::std::__cxx11::string::~string((string *)&name);
  ::std::__cxx11::string::~string((string *)&binding);
  SPIRType::~SPIRType(&type);
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_in_struct(const SPIRVariable &var, unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);

	string binding;
	bool use_location_number = true;
	bool legacy = hlsl_options.shader_model <= 30;
	if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
	{
		// Dual-source blending is achieved in HLSL by emitting to SV_Target0 and 1.
		uint32_t index = get_decoration(var.self, DecorationIndex);
		uint32_t location = get_decoration(var.self, DecorationLocation);

		if (index != 0 && location != 0)
			SPIRV_CROSS_THROW("Dual-source blending is only supported on MRT #0 in HLSL.");

		binding = join(legacy ? "COLOR" : "SV_Target", location + index);
		use_location_number = false;
		if (legacy) // COLOR must be a four-component vector on legacy shader model targets (HLSL ERR_COLOR_4COMP)
			type.vecsize = 4;
	}

	const auto get_vacant_location = [&]() -> uint32_t {
		for (uint32_t i = 0; i < 64; i++)
			if (!active_locations.count(i))
				return i;
		SPIRV_CROSS_THROW("All locations from 0 to 63 are exhausted.");
	};

	bool need_matrix_unroll = var.storage == StorageClassInput && execution.model == ExecutionModelVertex;

	auto &m = ir.meta[var.self].decoration;
	auto name = to_name(var.self);
	if (use_location_number)
	{
		uint32_t location_number;

		// If an explicit location exists, use it with TEXCOORD[N] semantic.
		// Otherwise, pick a vacant location.
		if (m.decoration_flags.get(DecorationLocation))
			location_number = m.location;
		else
			location_number = get_vacant_location();

		// Allow semantic remap if specified.
		auto semantic = to_semantic(location_number, execution.model, var.storage);

		if (need_matrix_unroll && type.columns > 1)
		{
			if (!type.array.empty())
				SPIRV_CROSS_THROW("Arrays of matrices used as input/output. This is not supported.");

			// Unroll matrices.
			for (uint32_t i = 0; i < type.columns; i++)
			{
				SPIRType newtype = type;
				newtype.columns = 1;
				statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)),
				          variable_decl(newtype, join(name, "_", i)), " : ", semantic, "_", i, ";");
				active_locations.insert(location_number++);
			}
		}
		else
		{
			statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)), variable_decl(type, name), " : ",
			          semantic, ";");

			// Structs and arrays should consume more locations.
			uint32_t consumed_locations = type_to_consumed_locations(type);
			for (uint32_t i = 0; i < consumed_locations; i++)
				active_locations.insert(location_number + i);
		}
	}
	else
		statement(variable_decl(type, name), " : ", binding, ";");
}